

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqast.h
# Opt level: O3

void __thiscall SQCompilation::DeclGroup::addDeclaration(DeclGroup *this,VarDecl *d)

{
  Decl *pDVar1;
  int iVar2;
  uint uVar3;
  VarDecl **__dest;
  ulong uVar4;
  
  uVar3 = (this->_decls)._size;
  if (uVar3 < (this->_decls)._allocated) {
    __dest = (this->_decls)._vals;
  }
  else {
    uVar4 = 4;
    if (uVar3 * 2 != 0) {
      uVar4 = (ulong)(uVar3 * 2);
    }
    __dest = (VarDecl **)Arena::allocate((this->_decls)._arena,uVar4 * 8);
    memcpy(__dest,(this->_decls)._vals,(ulong)(this->_decls)._size << 3);
    (this->_decls)._vals = __dest;
    (this->_decls)._allocated = (size_type_conflict)uVar4;
    uVar3 = (this->_decls)._size;
  }
  (this->_decls)._size = uVar3 + 1;
  __dest[uVar3] = d;
  pDVar1 = &(d->super_ValueDecl).super_Decl;
  iVar2 = (pDVar1->super_Statement).super_Node._coordinates.columnEnd;
  (this->super_Decl).super_Statement.super_Node._coordinates.lineEnd =
       (pDVar1->super_Statement).super_Node._coordinates.lineEnd;
  (this->super_Decl).super_Statement.super_Node._coordinates.columnEnd = iVar2;
  return;
}

Assistant:

void addDeclaration(VarDecl *d) {
      _decls.push_back(d);
      setLineEndPos(d->lineEnd());
      setColumnEndPos(d->columnEnd());
    }